

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::SlotI2
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId1,uint32 slotId2,
          ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  uint32 local_40;
  uint32 local_3c;
  RegSlot local_38;
  ProfileId local_34;
  OpCode local_32 [3];
  ProfileId profileId_local;
  OpCode op_local;
  
  local_34 = profileId;
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,local_32[0],(OpLayoutType)0x3f);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_32[0]);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6e8,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008a0409;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008a0409;
      *puVar3 = 0;
    }
    value_00 = FunctionBody::MapRegSlot(this->m_functionWrite,value);
    if ((((local_32[0] - 0x136 < 0xb) && ((0x501U >> (local_32[0] - 0x136 & 0x1f) & 1) != 0)) ||
        (local_32[0] == LdInnerSlot)) || (local_32[0] == LdEnvSlot)) {
      bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      if (!bVar2) {
        bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
        if (!bVar2) goto LAB_008a031e;
      }
      if (local_34 != 0xffff) {
        OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x6fc,"(false)",
                                  "The specified OpCode is not intended for slot access");
      if (!bVar2) goto LAB_008a0409;
      *puVar3 = 0;
    }
LAB_008a031e:
    bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_32[0],value_00,slotId1,slotId2);
    if (!bVar2) {
      bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,local_32[0],value_00,slotId1,slotId2);
      if (!bVar2) {
        local_40 = slotId1;
        local_3c = slotId2;
        local_38 = value_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
        Data::Write(&this->m_byteCodeData,&local_40,0xc);
      }
    }
    bVar2 = OpCodeAttr::IsProfiledOp(local_32[0]);
    if (bVar2) {
      Data::Write(&this->m_byteCodeData,&local_34,2);
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008a0409:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::SlotI2(OpCode op, RegSlot value, uint32 slotId1, uint32 slotId2, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

        switch (op)
        {
            case OpCode::LdInnerSlot:
            case OpCode::LdInnerObjSlot:
            case OpCode::LdEnvSlot:
            case OpCode::LdEnvObjSlot:
            case OpCode::LdModuleSlot:
                if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                    profileId != Constants::NoProfileId)
                {
                    OpCodeUtil::ConvertNonCallOpToProfiled(op);
                }
                break;

            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlotI2, op, value, slotId1, slotId2);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }